

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.hpp
# Opt level: O2

void __thiscall
Omega_h::MetricEdgeLengths<1,_1>::MetricEdgeLengths(MetricEdgeLengths<1,_1> *this,Mesh *mesh)

{
  allocator local_49;
  undefined1 local_48 [48];
  
  std::__cxx11::string::string((string *)(local_48 + 0x10),"metric",&local_49);
  Omega_h::Mesh::get_array<double>((Mesh *)local_48,(Int)mesh,(string *)0x0);
  MetricEdgeLengths(this,mesh,(Reals *)local_48);
  Write<double>::~Write((Write<double> *)local_48);
  std::__cxx11::string::~string((string *)(local_48 + 0x10));
  return;
}

Assistant:

MetricEdgeLengths(Mesh const* mesh)
      : MetricEdgeLengths(mesh, mesh->get_array<Real>(VERT, "metric")) {}